

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_setup_conn(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  
  Curl_conncontrol(conn,0);
  if (((data->state).http_neg.wanted == '\x04') &&
     (CVar1 = Curl_conn_may_http3(data,conn), CVar1 != CURLE_OK)) {
    return CVar1;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_setup_conn(struct Curl_easy *data,
                              struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  connkeep(conn, "HTTP default");
  if(data->state.http_neg.wanted == CURL_HTTP_V3x) {
    /* only HTTP/3, needs to work */
    CURLcode result = Curl_conn_may_http3(data, conn);
    if(result)
      return result;
  }
  return CURLE_OK;
}